

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionedTupleData::FlushAppendState
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state)

{
  pointer puVar1;
  type this_00;
  long lVar2;
  idx_t partition_index;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  lVar2 = 0;
  for (uVar3 = 0;
      puVar1 = (this->partitions).
               super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->partitions).
                            super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar3 = uVar3 + 1) {
    this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator*((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                           *)((long)&(puVar1->
                                     super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                     )._M_t + lVar4));
    TupleDataCollection::FinalizePinState
              (this_00,(TupleDataPinState *)
                       ((long)&(((state->partition_pin_states).
                                 super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                                 .
                                 super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->row_handles).handles +
                       lVar2));
    lVar2 = lVar2 + 0x38;
    lVar4 = lVar4 + 8;
  }
  return;
}

Assistant:

void PartitionedTupleData::FlushAppendState(PartitionedTupleDataAppendState &state) {
	for (idx_t partition_index = 0; partition_index < partitions.size(); partition_index++) {
		auto &partition = *partitions[partition_index];
		auto &partition_pin_state = state.partition_pin_states[partition_index];
		partition.FinalizePinState(partition_pin_state);
	}
}